

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O0

int bad_integer_constant_expression(dmr_C *C,expression *expr)

{
  expression *expr_local;
  dmr_C *C_local;
  
  if ((*(ushort *)expr >> 8 & 1) == 0) {
    C_local._4_4_ = 1;
  }
  else if (((expr->field_5).field_0.taint & 1) == 0) {
    C_local._4_4_ = 0;
  }
  else {
    C_local._4_4_ = 1;
  }
  return C_local._4_4_;
}

Assistant:

static inline int bad_integer_constant_expression(struct dmr_C *C, struct expression *expr)
{
        (void) C;
	if (!(expr->flags & Int_const_expr))
		return 1;
	if (expr->taint & Taint_comma)
		return 1;
	return 0;
}